

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_cpy_m_b_aarch64(void *vd,void *vn,void *vg,uint64_t mm,uint32_t desc)

{
  ulong uVar1;
  intptr_t iVar2;
  uint64_t uVar3;
  uint64_t pp;
  uint64_t nn;
  uint8_t *pg;
  uint64_t *n;
  uint64_t *d;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  uint64_t mm_local;
  void *vg_local;
  void *vn_local;
  void *vd_local;
  
  iVar2 = simd_oprsz(desc);
  for (opr_sz = 0; opr_sz < iVar2 / 8; opr_sz = opr_sz + 1) {
    uVar1 = *(ulong *)((long)vn + opr_sz * 8);
    uVar3 = expand_pred_b(*(uint8_t *)((long)vg + opr_sz));
    *(uint64_t *)((long)vd + opr_sz * 8) =
         (mm & 0xff) * 0x101010101010101 & uVar3 | uVar1 & (uVar3 ^ 0xffffffffffffffff);
  }
  return;
}

Assistant:

void HELPER(sve_cpy_m_b)(void *vd, void *vn, void *vg,
                         uint64_t mm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc) / 8;
    uint64_t *d = vd, *n = vn;
    uint8_t *pg = vg;

    mm = dup_const(MO_8, mm);
    for (i = 0; i < opr_sz; i += 1) {
        uint64_t nn = n[i];
        uint64_t pp = expand_pred_b(pg[H1(i)]);
        d[i] = (mm & pp) | (nn & ~pp);
    }
}